

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O1

upb_Map * upb_Map_DeepClone(upb_Map *map,upb_CType key_type,upb_CType value_type,
                           upb_MiniTable *map_entry_table,upb_Arena *arena)

{
  byte bVar1;
  upb_MiniTableField *puVar2;
  _Bool _Var3;
  upb_MapInsertStatus uVar4;
  upb_Map *map_00;
  upb_MiniTable *sub;
  ulong uVar5;
  size_t iter;
  upb_MessageValue val;
  upb_MessageValue key;
  size_t local_58;
  upb_MessageValue local_50;
  upb_MessageValue local_40;
  
  map_00 = _upb_Map_New(arena,(long)map->key_size,(long)map->val_size);
  if (map_00 != (upb_Map *)0x0) {
    local_58 = 0xffffffffffffffff;
    do {
      _Var3 = upb_Map_Next(map,&local_40,&local_50,&local_58);
      if (!_Var3) {
        return map_00;
      }
      if (map_entry_table->field_count_dont_copy_me__upb_internal_use_only != 2) {
        __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                      ,0xa5,
                      "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                     );
      }
      puVar2 = map_entry_table->fields_dont_copy_me__upb_internal_use_only;
      if (puVar2[1].number_dont_copy_me__upb_internal_use_only != 2) {
        __assert_fail("upb_MiniTableField_Number(f) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                      ,0xa7,
                      "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                     );
      }
      bVar1 = puVar2[1].descriptortype_dont_copy_me__upb_internal_use_only;
      if ((puVar2[1].mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
        if ((ulong)(bVar1 - 1) - 9 < 2) {
          sub = upb_MiniTable_GetSubMessageTable(map_entry_table,puVar2 + 1);
        }
        else {
LAB_00303424:
          sub = (upb_MiniTable *)0x0;
        }
      }
      else {
        if (bVar1 == 5) goto LAB_00303424;
        sub = (upb_MiniTable *)0x0;
        if (bVar1 != 0xc) goto LAB_003034ea;
      }
      bVar1 = puVar2[1].descriptortype_dont_copy_me__upb_internal_use_only;
      if ((puVar2[1].mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
        uVar5 = (ulong)(bVar1 - 1);
      }
      else {
        uVar5 = 0xd;
        if (bVar1 != 5) {
          if (bVar1 != 0xc) {
LAB_003034ea:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0x7b,
                          "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                         );
          }
          uVar5 = 8;
        }
      }
      _Var3 = upb_Clone_MessageValue
                        (&local_50,*(upb_CType *)(upb_FieldType_CType_c_type + uVar5 * 4),sub,arena)
      ;
    } while ((_Var3) &&
            (uVar4 = upb_Map_Insert(map_00,local_40,local_50,arena),
            uVar4 != kUpb_MapInsertStatus_OutOfMemory));
  }
  return (upb_Map *)0x0;
}

Assistant:

upb_Map* upb_Map_DeepClone(const upb_Map* map, upb_CType key_type,
                           upb_CType value_type,
                           const upb_MiniTable* map_entry_table,
                           upb_Arena* arena) {
  upb_Map* cloned_map = _upb_Map_New(arena, map->key_size, map->val_size);
  if (cloned_map == NULL) {
    return NULL;
  }
  upb_MessageValue key, val;
  size_t iter = kUpb_Map_Begin;
  while (upb_Map_Next(map, &key, &val, &iter)) {
    const upb_MiniTableField* value_field =
        upb_MiniTable_MapValue(map_entry_table);
    const upb_MiniTable* value_sub =
        upb_MiniTableField_CType(value_field) == kUpb_CType_Message
            ? upb_MiniTable_GetSubMessageTable(map_entry_table, value_field)
            : NULL;
    upb_CType value_field_type = upb_MiniTableField_CType(value_field);
    if (!upb_Clone_MessageValue(&val, value_field_type, value_sub, arena)) {
      return NULL;
    }
    if (!upb_Map_Set(cloned_map, key, val, arena)) {
      return NULL;
    }
  }
  return cloned_map;
}